

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_destel_well_map.hpp
# Opt level: O3

void __thiscall
PatchOptimizeDestelWellMap::inject_code(PatchOptimizeDestelWellMap *this,ROM *rom,World *world)

{
  World *pWVar1;
  uint32_t uVar2;
  mapped_type *ppMVar3;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<md::DataRegister> __l_02;
  initializer_list<md::AddressRegister> __l_03;
  Code func;
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  allocator_type local_10a;
  allocator_type local_109;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_108;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_f0;
  Code local_d8;
  World *local_60;
  ROM *local_58;
  AddressRegister local_50;
  AddressRegister local_40;
  
  uVar2 = inject_func_process_entity(rom);
  local_d8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_d8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130._8_8_ = local_130._8_8_ & 0xffffffffffffff00;
  local_130._0_8_ = &PTR_getXn_00262be0;
  local_120._M_local_buf[8] = '\x01';
  local_120._M_allocated_capacity = (size_type)&PTR_getXn_00262be0;
  __l._M_len = 2;
  __l._M_array = (iterator)local_130;
  local_d8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_108,__l,&local_109);
  local_50.super_Register._code = '\0';
  local_50.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  __l_00._M_len = 1;
  __l_00._M_array = &local_50;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_f0,__l_00,&local_10a);
  local_40.super_Register._code = '\a';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  md::Code::movem(&local_d8,&local_108,&local_f0,true,&local_40,LONG);
  if (local_f0.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_130._0_8_ = &PTR_getXn_00262cd8;
  local_130._8_8_ = (pointer)0x200ff1001;
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262be0;
  md::Code::move(&local_d8,(Param *)local_130,(Param *)&local_108,BYTE);
  local_130._0_8_ = &PTR_getXn_00262cd8;
  local_130._8_8_ = (pointer)0x200ff1001;
  md::Code::clr(&local_d8,(Param *)local_130,BYTE);
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c50;
  local_130._0_8_ = &PTR_getXn_00262cd8;
  local_130._8_8_ = (pointer)0x200ff5400;
  local_58 = rom;
  md::Code::lea(&local_d8,(Param *)local_130,(AddressRegister *)&local_108);
  local_130._0_8_ = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"loop","");
  md::Code::label(&local_d8,(string *)local_130);
  local_60 = world;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &local_120) {
    operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
  }
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c50;
  local_130._0_8_ = &PTR_getXn_00262c98;
  local_130._8_8_ = (pointer)0x200ff5480;
  md::Code::cmpa(&local_d8,(Param *)local_130,(AddressRegister *)&local_108);
  local_130._0_8_ = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"next_entity","");
  md::Code::beq(&local_d8,(string *)local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &local_120) {
    operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
  }
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c50;
  local_130._0_8_ = &PTR_getXn_00262c98;
  local_130._8_8_ = (pointer)0x200ff5b00;
  md::Code::cmpa(&local_d8,(Param *)local_130,(AddressRegister *)&local_108);
  local_130._0_8_ = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"ret","");
  md::Code::beq(&local_d8,(string *)local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &local_120) {
    operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
  }
  local_130._0_8_ = &PTR_getXn_00262cd8;
  local_130._12_4_ = 2;
  local_130._8_4_ = uVar2;
  md::Code::jsr(&local_d8,(Param *)local_130);
  local_130._0_8_ = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"next_entity","");
  md::Code::label(&local_d8,(string *)local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &local_120) {
    operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
  }
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c50;
  local_130._0_8_ = &PTR_getXn_00262c98;
  local_130._8_8_ = (pointer)0x200000080;
  md::Code::adda(&local_d8,(Param *)local_130,(AddressRegister *)&local_108);
  local_130._0_8_ = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"loop","");
  md::Code::bra(&local_d8,(string *)local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &local_120) {
    operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
  }
  local_130._0_8_ = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"ret","");
  md::Code::label(&local_d8,(string *)local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &local_120) {
    operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
  }
  local_130[8] = '\x01';
  local_130._0_8_ = &PTR_getXn_00262be0;
  md::Code::not_to_dx(&local_d8,(DataRegister *)local_130,BYTE);
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262be0;
  local_130._0_8_ = &PTR_getXn_00262c98;
  local_130._8_8_ = (pointer)0xf;
  md::Code::andi(&local_d8,(ImmediateValue *)local_130,(Param *)&local_108,BYTE);
  local_130._0_8_ = &PTR_getXn_00262cd8;
  local_130._8_8_ = (pointer)0x200ff1001;
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262be0;
  md::Code::and_to_dx(&local_d8,(Param *)local_130,(DataRegister *)&local_108,BYTE);
  local_130[8] = 1;
  local_130._0_8_ = &PTR_getXn_00262be0;
  md::Code::tst(&local_d8,(Param *)local_130,BYTE);
  local_130._0_8_ = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"no_sound","");
  md::Code::beq(&local_d8,(string *)local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &local_120) {
    operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
  }
  local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_108.
                         super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                         _M_impl.super__Vector_impl_data._M_start._2_6_,0x6c00);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_108;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130,__l_01,
             (allocator_type *)&local_f0);
  md::Code::trap(&local_d8,'\0',(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity - local_130._0_8_);
  }
  local_130._0_8_ = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"no_sound","");
  md::Code::label(&local_d8,(string *)local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &local_120) {
    operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
  }
  local_130._8_8_ = local_130._8_8_ & 0xffffffffffffff00;
  local_130._0_8_ = &PTR_getXn_00262be0;
  local_120._M_local_buf[8] = '\x01';
  local_120._M_allocated_capacity = (size_type)&PTR_getXn_00262be0;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_130;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_108,__l_02,&local_109);
  local_50.super_Register._code = '\0';
  local_50.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  __l_03._M_len = 1;
  __l_03._M_array = &local_50;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_f0,__l_03,&local_10a);
  local_40.super_Register._code = '\a';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  md::Code::movem(&local_d8,&local_108,&local_f0,false,&local_40,LONG);
  if (local_f0.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  md::Code::rts(&local_d8);
  local_130._0_8_ = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"");
  uVar2 = md::ROM::inject_code(local_58,&local_d8,(string *)local_130);
  pWVar1 = local_60;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &local_120) {
    operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
  }
  local_130._0_2_ = 0x112;
  ppMVar3 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(&pWVar1->_maps,(key_type *)local_130);
  (*ppMVar3)->_map_update_addr = uVar2;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_d8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_d8._pending_branches._M_t);
  if (local_d8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        uint32_t func_process_entity = inject_func_process_entity(rom);

        md::Code func;
        func.movem_to_stack({ reg_D0, reg_D1 }, { reg_A0 });
        {
            func.moveb(addr_(0xFF1001), reg_D1);    // Store old flag state in D1
            func.clrb(addr_(0xFF1001));

            func.lea(0xFF5400, reg_A0);
            func.label("loop");
            {
                func.cmpa(0xFF5480, reg_A0); // No need to check anything with the door
                func.beq("next_entity");
                func.cmpa(0xFF5B00, reg_A0); // End of array
                func.beq("ret");
                func.jsr(func_process_entity);
                func.label("next_entity");
                func.adda(0x80, reg_A0);
            }
            func.bra("loop");
        }
        func.label("ret");
        // Compare old flag state to new flag state: if any new holes have been filled, play a switch sound
        func.notb(reg_D1);
        func.andib(0x0F, reg_D1);
        func.andb(addr_(0xFF1001), reg_D1);
        func.tstb(reg_D1);
        func.beq("no_sound");
        {
            func.trap(0, { 0x00, 0x6C });
        }
        func.label("no_sound");
        func.movem_from_stack({ reg_D0, reg_D1 }, { reg_A0 });
        func.rts();

        uint32_t update_func_addr = rom.inject_code(func);
        world.map(MAP_DESTEL_WELL_274)->map_update_addr(update_func_addr);
    }